

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qcontainertools_impl.h
# Opt level: O3

void QtPrivate::q_relocate_overlap_n_left_move<std::reverse_iterator<Replace*>,long_long>
               (reverse_iterator<Replace_*> first,longlong n,reverse_iterator<Replace_*> d_first)

{
  undefined8 uVar1;
  char16_t *pcVar2;
  qsizetype qVar3;
  Data *pDVar4;
  int *piVar5;
  Replace *pRVar6;
  Replace *pRVar7;
  Replace *pRVar8;
  Replace *pRVar9;
  long in_FS_OFFSET;
  Destructor local_38;
  long local_20;
  
  local_20 = *(long *)(in_FS_OFFSET + 0x28);
  local_38.end.current = (Replace *)((d_first.current)->in).d.d;
  pRVar6 = local_38.end.current + -n;
  pRVar9 = (Replace *)((first.current)->in).d.d;
  local_38.intermediate.current = local_38.end.current;
  pRVar7 = pRVar6;
  pRVar8 = pRVar9;
  if (pRVar6 < pRVar9) {
    pRVar7 = pRVar9;
    pRVar8 = pRVar6;
  }
  while (local_38.intermediate.current != pRVar7) {
    uVar1 = *(undefined8 *)&pRVar9[-1].in.d.d;
    *(undefined8 *)&pRVar9[-1].in.d.d = 0;
    *(undefined8 *)&local_38.intermediate.current[-1].in.d.d = uVar1;
    pcVar2 = pRVar9[-1].in.d.ptr;
    pRVar9[-1].in.d.ptr = (char16_t *)0x0;
    local_38.intermediate.current[-1].in.d.ptr = pcVar2;
    qVar3 = pRVar9[-1].in.d.size;
    pRVar9[-1].in.d.size = 0;
    local_38.intermediate.current[-1].in.d.size = qVar3;
    pDVar4 = pRVar9[-1].out.d.d;
    pRVar9[-1].out.d.d = (Data *)0x0;
    local_38.intermediate.current[-1].out.d.d = pDVar4;
    pcVar2 = pRVar9[-1].out.d.ptr;
    pRVar9[-1].out.d.ptr = (char16_t *)0x0;
    local_38.intermediate.current[-1].out.d.ptr = pcVar2;
    qVar3 = pRVar9[-1].out.d.size;
    pRVar9[-1].out.d.size = 0;
    local_38.intermediate.current[-1].out.d.size = qVar3;
    ((d_first.current)->in).d.d = ((d_first.current)->in).d.d + -3;
    pRVar9 = (Replace *)(((first.current)->in).d.d + -3);
    ((first.current)->in).d.d = (Data *)pRVar9;
    local_38.intermediate.current = (Replace *)((d_first.current)->in).d.d;
  }
  local_38.iter = &local_38.end;
  pRVar7 = local_38.intermediate.current;
  while (pRVar7 != pRVar6) {
    uVar1 = *(undefined8 *)&pRVar7[-1].in.d.d;
    *(undefined8 *)&pRVar7[-1].in.d.d = *(undefined8 *)&pRVar9[-1].in.d.d;
    *(undefined8 *)&pRVar9[-1].in.d.d = uVar1;
    pcVar2 = pRVar7[-1].in.d.ptr;
    pRVar7[-1].in.d.ptr = pRVar9[-1].in.d.ptr;
    pRVar9[-1].in.d.ptr = pcVar2;
    qVar3 = pRVar7[-1].in.d.size;
    pRVar7[-1].in.d.size = pRVar9[-1].in.d.size;
    pRVar9[-1].in.d.size = qVar3;
    pDVar4 = pRVar7[-1].out.d.d;
    pRVar7[-1].out.d.d = pRVar9[-1].out.d.d;
    pRVar9[-1].out.d.d = pDVar4;
    pcVar2 = pRVar7[-1].out.d.ptr;
    pRVar7[-1].out.d.ptr = pRVar9[-1].out.d.ptr;
    pRVar9[-1].out.d.ptr = pcVar2;
    qVar3 = pRVar7[-1].out.d.size;
    pRVar7[-1].out.d.size = pRVar9[-1].out.d.size;
    pRVar9[-1].out.d.size = qVar3;
    ((d_first.current)->in).d.d = ((d_first.current)->in).d.d + -3;
    pRVar9 = (Replace *)(((first.current)->in).d.d + -3);
    ((first.current)->in).d.d = (Data *)pRVar9;
    pRVar7 = (Replace *)((d_first.current)->in).d.d;
  }
  while (pRVar9 != pRVar8) {
    ((first.current)->in).d.d = (Data *)(pRVar9 + 1);
    pDVar4 = (pRVar9->out).d.d;
    if (pDVar4 != (Data *)0x0) {
      LOCK();
      (pDVar4->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
           (pDVar4->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if ((pDVar4->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(&((pRVar9->out).d.d)->super_QArrayData,2,0x10);
      }
    }
    piVar5 = *(int **)&(pRVar9->in).d.d;
    if (piVar5 != (int *)0x0) {
      LOCK();
      *piVar5 = *piVar5 + -1;
      UNLOCK();
      if (*piVar5 == 0) {
        QArrayData::deallocate(*(QArrayData **)&(pRVar9->in).d.d,2,0x10);
      }
    }
    pRVar9 = (Replace *)((first.current)->in).d.d;
  }
  q_relocate_overlap_n_left_move<std::reverse_iterator<Replace_*>,_long_long>::Destructor::
  ~Destructor(&local_38);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_20) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void q_relocate_overlap_n_left_move(iterator first, N n, iterator d_first)
{
    // requires: [first, n) is a valid range
    // requires: d_first + n is reachable from d_first
    // requires: iterator is at least a random access iterator
    // requires: value_type(iterator) has a non-throwing destructor

    Q_ASSERT(n);
    Q_ASSERT(d_first < first); // only allow moves to the "left"
    using T = typename std::iterator_traits<iterator>::value_type;

    // Watches passed iterator. Unless commit() is called, all the elements that
    // the watched iterator passes through are deleted at the end of object
    // lifetime. freeze() could be used to stop watching the passed iterator and
    // remain at current place.
    //
    // requires: the iterator is expected to always point to an invalid object
    //           (to uninitialized memory)
    struct Destructor
    {
        iterator *iter;
        iterator end;
        iterator intermediate;

        Destructor(iterator &it) noexcept : iter(std::addressof(it)), end(it) { }
        void commit() noexcept { iter = std::addressof(end); }
        void freeze() noexcept
        {
            intermediate = *iter;
            iter = std::addressof(intermediate);
        }
        ~Destructor() noexcept
        {
            for (const int step = *iter < end ? 1 : -1; *iter != end;) {
                std::advance(*iter, step);
                (*iter)->~T();
            }
        }
    } destroyer(d_first);

    const iterator d_last = d_first + n;
    // Note: use pair and explicitly copy iterators from it to prevent
    // accidental reference semantics instead of copy. equivalent to:
    //
    // auto [overlapBegin, overlapEnd] = std::minmax(d_last, first);
    auto pair = std::minmax(d_last, first);

    // overlap area between [d_first, d_first + n) and [first, first + n) or an
    // uninitialized memory area between the two ranges
    iterator overlapBegin = pair.first;
    iterator overlapEnd = pair.second;

    // move construct elements in uninitialized region
    while (d_first != overlapBegin) {
        // account for std::reverse_iterator, cannot use new(d_first) directly
        new (std::addressof(*d_first)) T(std::move_if_noexcept(*first));
        ++d_first;
        ++first;
    }

    // cannot commit but have to stop - there might be an overlap region
    // which we don't want to delete (because it's part of existing data)
    destroyer.freeze();

    // move assign elements in overlap region
    while (d_first != d_last) {
        *d_first = std::move_if_noexcept(*first);
        ++d_first;
        ++first;
    }

    Q_ASSERT(d_first == destroyer.end + n);
    destroyer.commit(); // can commit here as ~T() below does not throw

    while (first != overlapEnd)
        (--first)->~T();
}